

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

int rnndec_varadd(rnndeccontext *ctx,char *varset,char *variant)

{
  rnnvalue **pprVar1;
  int iVar2;
  rnnenum *prVar3;
  rnndecvariant *prVar4;
  rnndecvariant **pprVar5;
  int iVar6;
  long lVar7;
  
  prVar3 = rnn_findenum(ctx->db,varset);
  if (prVar3 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    iVar6 = prVar3->valsnum;
    if (0 < (long)iVar6) {
      pprVar1 = prVar3->vals;
      lVar7 = 0;
      do {
        iVar2 = strcasecmp(pprVar1[lVar7]->name,variant);
        if (iVar2 == 0) {
          prVar4 = (rnndecvariant *)calloc(0x10,1);
          prVar4->en = prVar3;
          prVar4->variant = (int)lVar7;
          iVar6 = ctx->varsnum;
          iVar2 = ctx->varsmax;
          if (iVar6 < iVar2) {
            pprVar5 = ctx->vars;
          }
          else {
            iVar6 = 0x10;
            if (iVar2 != 0) {
              iVar6 = iVar2 * 2;
            }
            ctx->varsmax = iVar6;
            pprVar5 = (rnndecvariant **)realloc(ctx->vars,(long)iVar6 << 3);
            ctx->vars = pprVar5;
            iVar6 = ctx->varsnum;
          }
          ctx->varsnum = iVar6 + 1;
          pprVar5[iVar6] = prVar4;
          return 1;
        }
        lVar7 = lVar7 + 1;
      } while (iVar6 != lVar7);
    }
    fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",variant,varset);
  }
  return 0;
}

Assistant:

int rnndec_varadd(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}